

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_line_reporter.h
# Opt level: O3

void __thiscall bandit::detail::single_line_reporter::print_status_line(single_line_reporter *this)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  char local_21;
  
  std::__ostream_insert<char,std::char_traits<char>>(this->stm_,&local_21,1);
  poVar2 = this->stm_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Executed ",9);
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)poVar2,(this->super_progress_reporter).specs_run_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," tests.",7);
  if ((this->super_progress_reporter).specs_failed_ != 0) {
    poVar2 = this->stm_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar2,(this->super_progress_reporter).specs_succeeded_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," succeeded. ",0xc);
    pcVar4 = "\x1b[1;31m";
    lVar3 = 0;
    if (this->colorizer_->colors_enabled_ == false) {
      pcVar4 = "";
    }
    else {
      lVar3 = 7;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar2,(this->super_progress_reporter).specs_failed_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," failed.",8);
    bVar1 = this->colorizer_->colors_enabled_;
    pcVar4 = "\x1b[0m";
    if (bVar1 == false) {
      pcVar4 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,(ulong)bVar1 << 2);
  }
  std::ostream::flush();
  return;
}

Assistant:

void print_status_line()
    {
      stm_ << '\r';
      stm_ << "Executed " << specs_run_ << " tests.";

      if(specs_failed_)
      {
        stm_ << " " << specs_succeeded_ << " succeeded. " << colorizer_.red() << specs_failed_ <<
          " failed." << colorizer_.reset();
      }
      stm_.flush();
    }